

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int initializeMutexes(void)

{
  errorLock = __PHYSFS_platformCreateMutex();
  if (errorLock != (void *)0x0) {
    stateLock = __PHYSFS_platformCreateMutex();
    if (stateLock != (void *)0x0) {
      return 1;
    }
    stateLock = (void *)0x0;
  }
  if (errorLock != (void *)0x0) {
    __PHYSFS_platformDestroyMutex(errorLock);
  }
  if (stateLock != (void *)0x0) {
    __PHYSFS_platformDestroyMutex(stateLock);
  }
  stateLock = (void *)0x0;
  errorLock = (void *)0x0;
  return 0;
}

Assistant:

static int initializeMutexes(void)
{
    errorLock = __PHYSFS_platformCreateMutex();
    if (errorLock == NULL)
        goto initializeMutexes_failed;

    stateLock = __PHYSFS_platformCreateMutex();
    if (stateLock == NULL)
        goto initializeMutexes_failed;

    return 1;  /* success. */

initializeMutexes_failed:
    if (errorLock != NULL)
        __PHYSFS_platformDestroyMutex(errorLock);

    if (stateLock != NULL)
        __PHYSFS_platformDestroyMutex(stateLock);

    errorLock = stateLock = NULL;
    return 0;  /* failed. */
}